

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O1

BasicValue *
cvm::Native::Exp(BasicValue *__return_storage_ptr__,
                list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  p_Var1 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)Args) {
    __return_storage_ptr__->Type = DoubleType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2).DoubleVal = 0.0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    dVar2 = BasicValue::toDouble((BasicValue *)(p_Var1 + 1));
    dVar2 = exp(dVar2);
    __return_storage_ptr__->Type = DoubleType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2).DoubleVal = dVar2;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::Exp(std::list<BasicValue> &Args) {
  if (Args.empty())
    return 0.0;
  return std::exp(Args.front().toDouble());
}